

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmRtm<(moira::Instr)158,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  Av<(moira::Instr)158,_(moira::Mode)12,_4> local_1c;
  
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Rn)(op & 0xf));
  local_1c.ext1 = 0;
  StrWriter::operator<<(str,&local_1c);
  return;
}

Assistant:

void
Moira::dasmRtm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Rn ( ____________xxxx(op) );

    str << Ins<I>{} << str.tab << src;
    str << Av<I, M, S>{};
}